

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O3

int32_t __thiscall
icu_63::CollationIterator::fetchCEs(CollationIterator *this,UErrorCode *errorCode)

{
  UErrorCode UVar1;
  int64_t iVar2;
  
  UVar1 = *errorCode;
  while ((UVar1 < U_ILLEGAL_ARGUMENT_ERROR && (iVar2 = nextCE(this,errorCode), iVar2 != 0x101000100)
         )) {
    this->cesIndex = (this->ceBuffer).length;
    UVar1 = *errorCode;
  }
  return (this->ceBuffer).length;
}

Assistant:

int32_t
CollationIterator::fetchCEs(UErrorCode &errorCode) {
    while(U_SUCCESS(errorCode) && nextCE(errorCode) != Collation::NO_CE) {
        // No need to loop for each expansion CE.
        cesIndex = ceBuffer.length;
    }
    return ceBuffer.length;
}